

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnDiskIndex.cpp
# Opt level: O0

QueryResult * __thiscall
OnDiskIndex::query(OnDiskIndex *this,TriGram trigram,QueryCounters *counters)

{
  QueryCounters *in_RCX;
  QueryResult *in_RSI;
  QueryResult *in_RDI;
  QueryCounter *in_stack_ffffffffffffffc8;
  TriGram in_stack_ffffffffffffffd4;
  OnDiskIndex *in_stack_ffffffffffffffd8;
  
  QueryCounters::reads(in_RCX);
  query_primitive(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,in_stack_ffffffffffffffc8);
  QueryResult::QueryResult(in_RSI,&in_RDI->results);
  SortedRun::~SortedRun(&in_RSI->results);
  return in_RDI;
}

Assistant:

QueryResult OnDiskIndex::query(TriGram trigram, QueryCounters *counters) const {
    return QueryResult(std::move(query_primitive(trigram, &counters->reads())));
}